

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O2

void __thiscall despot::Tag::PrintObs(Tag *this,State *state,OBS_TYPE obs,ostream *out)

{
  int iVar1;
  undefined8 uVar2;
  ostream *poVar3;
  char *pcVar4;
  
  iVar1 = despot::Floor::NumCells();
  if ((long)iVar1 == obs) {
    pcVar4 = "On opponent";
  }
  else {
    uVar2 = despot::Floor::GetCell((int)this + 0x58);
    poVar3 = std::operator<<(out,"Rob at (");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(int)uVar2);
    poVar3 = std::operator<<(poVar3,", ");
    out = (ostream *)std::ostream::operator<<((ostream *)poVar3,(int)((ulong)uVar2 >> 0x20));
    pcVar4 = ")";
  }
  poVar3 = std::operator<<(out,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void Tag::PrintObs(const State& state, OBS_TYPE obs, ostream& out) const {
	if (obs == floor_.NumCells()) {
		out << "On opponent" << endl;
	} else {
		Coord rob = floor_.GetCell(obs);
		out << "Rob at (" << rob.x << ", " << rob.y << ")" << endl;
	}
}